

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall kratos::PackedStruct::same(PackedStruct *this,PackedStruct *def)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference this_00;
  const_reference def_00;
  uint local_24;
  uint i;
  PackedStruct *def_local;
  PackedStruct *this_local;
  
  sVar2 = std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
          size(&this->attributes);
  sVar3 = std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
          size(&def->attributes);
  if (sVar2 == sVar3) {
    for (local_24 = 0;
        sVar2 = std::
                vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                ::size(&this->attributes), local_24 < sVar2; local_24 = local_24 + 1) {
      this_00 = std::
                vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                ::operator[](&this->attributes,(ulong)local_24);
      def_00 = std::
               vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
               operator[](&def->attributes,(ulong)local_24);
      bVar1 = PackedStructFieldDef::same(this_00,def_00);
      if (!bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PackedStruct::same(const PackedStruct &def) const {
    if (attributes.size() != def.attributes.size()) return false;
    for (auto i = 0u; i < attributes.size(); i++) {
        if (!attributes[i].same(def.attributes[i])) return false;
    }
    return true;
}